

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.h
# Opt level: O1

void __thiscall BitStreamReader::skipBit(BitStreamReader *this)

{
  uint uVar1;
  undefined8 *puVar2;
  uint *buff;
  
  if ((this->super_BitStream).m_totalBits != 0) {
    if (this->m_bitLeft == 0) {
      buff = (this->super_BitStream).m_buffer + 1;
      (this->super_BitStream).m_buffer = buff;
      uVar1 = getCurVal(this,buff);
      this->m_curVal = uVar1;
      uVar1 = 0x1f;
    }
    else {
      uVar1 = this->m_bitLeft - 1;
    }
    this->m_bitLeft = uVar1;
    (this->super_BitStream).m_totalBits = (this->super_BitStream).m_totalBits - 1;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_0023f8a8;
  __cxa_throw(puVar2,&BitStreamException::typeinfo,std::exception::~exception);
}

Assistant:

void skipBit()
    {
        if (m_totalBits < 1)
            THROW_BITSTREAM_ERR;
        if (m_bitLeft > 0)
            m_bitLeft--;
        else
        {
            m_buffer++;
            m_curVal = getCurVal(m_buffer);
            m_bitLeft = INT_BIT - 1;
        }
        m_totalBits--;
    }